

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall QList<QPoint>::reserve(QList<QPoint> *this,qsizetype asize)

{
  bool bVar1;
  Int IVar2;
  QArrayDataPointer<QPoint> *pQVar3;
  qsizetype qVar4;
  QPoint *b;
  Data *pDVar5;
  long in_RSI;
  QArrayDataPointer<QPoint> *in_RDI;
  long in_FS_OFFSET;
  DataPointer detached;
  QArrayDataPointer<QPoint> *in_stack_ffffffffffffff78;
  QFlagsStorage<QArrayData::ArrayOption> f;
  QArrayDataPointer<QPoint> *in_stack_ffffffffffffff80;
  QArrayDataPointer<QPoint> *in_stack_ffffffffffffff88;
  AllocationOption option;
  QPodArrayOps<QPoint> *in_stack_ffffffffffffff90;
  qsizetype local_40;
  QArrayDataPointer<QPoint> local_38;
  QFlagsStorageHelper<QArrayData::ArrayOption,_4> local_18;
  QFlagsStorageHelper<QArrayData::ArrayOption,_4> local_14;
  longlong local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = (QArrayDataPointer<QPoint> *)capacity((QList<QPoint> *)0xa431af);
  qVar4 = QArrayDataPointer<QPoint>::freeSpaceAtBegin(in_stack_ffffffffffffff88);
  option = (AllocationOption)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  if (in_RSI <= (long)pQVar3 - qVar4) {
    QArrayDataPointer<QPoint>::operator->(in_RDI);
    local_18.super_QFlagsStorage<QArrayData::ArrayOption>.i =
         (QFlagsStorage<QArrayData::ArrayOption>)
         QArrayDataPointer<QPoint>::flags(in_stack_ffffffffffffff80);
    local_14.super_QFlagsStorage<QArrayData::ArrayOption>.i =
         (QFlagsStorage<QArrayData::ArrayOption>)
         QFlags<QArrayData::ArrayOption>::operator&
                   ((QFlags<QArrayData::ArrayOption> *)in_stack_ffffffffffffff80,
                    (ArrayOption)((ulong)in_stack_ffffffffffffff78 >> 0x20));
    IVar2 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_14);
    if (IVar2 != 0) goto LAB_00a43352;
    QArrayDataPointer<QPoint>::operator->(in_RDI);
    bVar1 = QArrayDataPointer<QPoint>::isShared(in_stack_ffffffffffffff80);
    if (!bVar1) {
      QArrayDataPointer<QPoint>::operator->(in_RDI);
      f.i = (Int)((ulong)in_stack_ffffffffffffff78 >> 0x20);
      QFlags<QArrayData::ArrayOption>::QFlags
                ((QFlags<QArrayData::ArrayOption> *)in_stack_ffffffffffffff80,f.i);
      QArrayDataPointer<QPoint>::setFlag((QArrayDataPointer<QPoint> *)0xa43256,(ArrayOptions)f.i);
      goto LAB_00a43352;
    }
  }
  local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.ptr = (QPoint *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_40 = size((QList<QPoint> *)in_RDI);
  qMax<long_long>(&local_10,&local_40);
  QArrayDataPointer<QPoint>::QArrayDataPointer
            (pQVar3,(qsizetype)in_RDI,(qsizetype)in_stack_ffffffffffffff90,option);
  pQVar3 = (QArrayDataPointer<QPoint> *)QArrayDataPointer<QPoint>::operator->(&local_38);
  QArrayDataPointer<QPoint>::operator->(in_RDI);
  b = QArrayDataPointer<QPoint>::begin((QArrayDataPointer<QPoint> *)0xa432d6);
  QArrayDataPointer<QPoint>::operator->(in_RDI);
  QArrayDataPointer<QPoint>::end(pQVar3);
  QtPrivate::QPodArrayOps<QPoint>::copyAppend(in_stack_ffffffffffffff90,b,(QPoint *)pQVar3);
  pDVar5 = QArrayDataPointer<QPoint>::d_ptr(&local_38);
  if (pDVar5 != (Data *)0x0) {
    in_stack_ffffffffffffff78 =
         (QArrayDataPointer<QPoint> *)QArrayDataPointer<QPoint>::operator->(&local_38);
    QFlags<QArrayData::ArrayOption>::QFlags
              ((QFlags<QArrayData::ArrayOption> *)pQVar3,
               (ArrayOption)((ulong)in_stack_ffffffffffffff78 >> 0x20));
    QArrayDataPointer<QPoint>::setFlag
              ((QArrayDataPointer<QPoint> *)0xa43339,
               (QFlagsStorageHelper<QArrayData::ArrayOption,_4>)
               SUB84((ulong)in_stack_ffffffffffffff78 >> 0x20,0));
  }
  QArrayDataPointer<QPoint>::swap(pQVar3,in_stack_ffffffffffffff78);
  QArrayDataPointer<QPoint>::~QArrayDataPointer(pQVar3);
LAB_00a43352:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QList<T>::reserve(qsizetype asize)
{
    // capacity() == 0 for immutable data, so this will force a detaching below
    if (asize <= capacity() - d.freeSpaceAtBegin()) {
        if (d->flags() & Data::CapacityReserved)
            return;  // already reserved, don't shrink
        if (!d->isShared()) {
            // accept current allocation, don't shrink
            d->setFlag(Data::CapacityReserved);
            return;
        }
    }

    DataPointer detached(qMax(asize, size()));
    detached->copyAppend(d->begin(), d->end());
    if (detached.d_ptr())
        detached->setFlag(Data::CapacityReserved);
    d.swap(detached);
}